

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_DeleteKVPair(ktxHashList *pHead,char *key)

{
  void *__s1;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  char *in_RSI;
  long *in_RDI;
  UT_hash_handle *_hd_hh_del;
  uint _hd_bkt;
  char *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _hf_bkt;
  ktxKVListEntry *kv;
  char *local_40;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  long local_20;
  ktx_error_code_e local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RSI == (char *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_20 = 0;
    if (*in_RDI != 0) {
      local_28 = 0xfeedbeef;
      local_30 = 0x9e3779b9;
      local_2c = 0x9e3779b9;
      sVar5 = strlen(in_RSI);
      local_40 = in_RSI;
      for (local_34 = (uint)sVar5; 0xb < local_34; local_34 = local_34 - 0xc) {
        iVar1 = (int)local_40[4] + local_40[5] * 0x100 + local_40[6] * 0x10000 +
                local_40[7] * 0x1000000 + local_30;
        local_28 = (int)local_40[8] + local_40[9] * 0x100 + local_40[10] * 0x10000 +
                   local_40[0xb] * 0x1000000 + local_28;
        uVar2 = local_28 >> 0xd ^
                (((int)*local_40 + local_40[1] * 0x100 + local_40[2] * 0x10000 +
                  local_40[3] * 0x1000000 + local_2c) - iVar1) - local_28;
        uVar3 = uVar2 << 8 ^ (iVar1 - local_28) - uVar2;
        uVar4 = uVar3 >> 0xd ^ (local_28 - uVar2) - uVar3;
        uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
        uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
        local_2c = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
        local_30 = local_2c << 10 ^ (uVar3 - uVar4) - local_2c;
        local_28 = local_30 >> 0xf ^ (uVar4 - local_2c) - local_30;
        local_40 = local_40 + 0xc;
      }
      sVar5 = strlen(in_RSI);
      local_28 = local_28 + (int)sVar5;
      switch(local_34) {
      case 0xb:
        local_28 = local_40[10] * 0x1000000 + local_28;
      case 10:
        local_28 = local_40[9] * 0x10000 + local_28;
      case 9:
        local_28 = local_40[8] * 0x100 + local_28;
      case 8:
        local_30 = local_40[7] * 0x1000000 + local_30;
      case 7:
        local_30 = local_40[6] * 0x10000 + local_30;
      case 6:
        local_30 = local_40[5] * 0x100 + local_30;
      case 5:
        local_30 = (int)local_40[4] + local_30;
      case 4:
        local_2c = local_40[3] * 0x1000000 + local_2c;
      case 3:
        local_2c = local_40[2] * 0x10000 + local_2c;
      case 2:
        local_2c = local_40[1] * 0x100 + local_2c;
      case 1:
        local_2c = (int)*local_40 + local_2c;
      default:
        uVar2 = local_28 >> 0xd ^ (local_2c - local_30) - local_28;
        uVar3 = uVar2 << 8 ^ (local_30 - local_28) - uVar2;
        uVar4 = uVar3 >> 0xd ^ (local_28 - uVar2) - uVar3;
        uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
        uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
        uVar2 = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 << 10 ^ (uVar3 - uVar4) - uVar2;
        uVar2 = (uVar3 >> 0xf ^ (uVar4 - uVar2) - uVar3) &
                *(int *)(*(long *)(*in_RDI + 0x20) + 8) - 1U;
        if (*(long *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar2 * 0x10) == 0) {
          local_20 = 0;
        }
        else {
          local_20 = *(long *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar2 * 0x10) -
                     *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
        }
      }
      while (local_20 != 0) {
        iVar1 = *(int *)(local_20 + 0x50);
        sVar5 = strlen(in_RSI);
        if (iVar1 == (int)sVar5) {
          __s1 = *(void **)(local_20 + 0x48);
          sVar5 = strlen(in_RSI);
          iVar1 = memcmp(__s1,in_RSI,sVar5 & 0xffffffff);
          if (iVar1 == 0) break;
        }
        if (*(long *)(local_20 + 0x40) == 0) {
          local_20 = 0;
        }
        else {
          local_20 = *(long *)(local_20 + 0x40) - *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
        }
      }
    }
    if (local_20 != 0) {
      if ((*(long *)(local_20 + 0x28) == 0) && (*(long *)(local_20 + 0x30) == 0)) {
        free((void *)**(undefined8 **)(*in_RDI + 0x20));
        free(*(void **)(*in_RDI + 0x20));
        *in_RDI = 0;
      }
      else {
        if (local_20 ==
            *(long *)(*(long *)(*in_RDI + 0x20) + 0x18) -
            *(long *)(*(long *)(*in_RDI + 0x20) + 0x20)) {
          *(long *)(*(long *)(*in_RDI + 0x20) + 0x18) =
               *(long *)(local_20 + 0x28) + *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
        }
        if (*(long *)(local_20 + 0x28) == 0) {
          *in_RDI = *(long *)(local_20 + 0x30);
        }
        else {
          *(undefined8 *)
           (*(long *)(local_20 + 0x28) + 0x10 + *(long *)(*(long *)(*in_RDI + 0x20) + 0x20)) =
               *(undefined8 *)(local_20 + 0x30);
        }
        if (*(long *)(local_20 + 0x30) != 0) {
          *(undefined8 *)
           (*(long *)(local_20 + 0x30) + 8 + *(long *)(*(long *)(*in_RDI + 0x20) + 0x20)) =
               *(undefined8 *)(local_20 + 0x28);
        }
        uVar2 = *(uint *)(local_20 + 0x54) & *(int *)(*(long *)(*in_RDI + 0x20) + 8) - 1U;
        lVar6 = **(long **)(*in_RDI + 0x20) + (ulong)uVar2 * 0x10;
        *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + -1;
        if (*(long *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar2 * 0x10) == local_20 + 0x20) {
          *(undefined8 *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar2 * 0x10) =
               *(undefined8 *)(local_20 + 0x40);
        }
        if (*(long *)(local_20 + 0x38) != 0) {
          *(undefined8 *)(*(long *)(local_20 + 0x38) + 0x20) = *(undefined8 *)(local_20 + 0x40);
        }
        if (*(long *)(local_20 + 0x40) != 0) {
          *(undefined8 *)(*(long *)(local_20 + 0x40) + 0x18) = *(undefined8 *)(local_20 + 0x38);
        }
        *(int *)(*(long *)(*in_RDI + 0x20) + 0x10) = *(int *)(*(long *)(*in_RDI + 0x20) + 0x10) + -1
        ;
      }
    }
    local_4 = KTX_SUCCESS;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashList_DeleteKVPair(ktxHashList* pHead, const char* key)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: pointer to target entry. */
        if (kv != NULL)
            HASH_DEL(*pHead, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}